

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O1

void __thiscall cppnet::RWSocket::Read(RWSocket *this)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  int iVar5;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar7;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_38;
  element_type *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  Event *pEVar6;
  
  if (this->_event == (Event *)0x0) {
    peVar2 = (((this->_alloter).super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar5 = (*peVar2->_vptr_Alloter[3])(peVar2,0x28);
    pEVar6 = (Event *)CONCAT44(extraout_var,iVar5);
    if (pEVar6 == (Event *)0x0) {
      pEVar6 = (Event *)0x0;
    }
    else {
      pEVar6->_vptr_Event = (_func_int **)&PTR__Event_001230a8;
      pEVar6->_data = (void *)0x0;
      pEVar6->_event_type = 0;
      (pEVar6->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pEVar6->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    this->_event = pEVar6;
    std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppnet::RWSocket,void>
              ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_40,
               (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cppnet::RWSocket>);
    peVar4 = local_40;
    local_30 = local_40;
    local_28._M_pi = p_Stack_38;
    local_40 = (element_type *)0x0;
    p_Stack_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pEVar6->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pEVar6->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_28);
    if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
    }
    if (p_Stack_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_38);
    }
  }
  this_00 = (this->super_Socket)._event_actions.
            super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar5 = this_00->_M_use_count;
    do {
      if (iVar5 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar7 = iVar5 == iVar1;
      if (bVar7) {
        this_00->_M_use_count = iVar5 + 1;
        iVar1 = iVar5;
      }
      iVar5 = iVar1;
      UNLOCK();
    } while (!bVar7);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar7 = true;
  }
  else {
    bVar7 = this_00->_M_use_count == 0;
  }
  peVar3 = (this->super_Socket)._event_actions.
           super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 != (element_type *)0x0 && !bVar7) {
    (*peVar3->_vptr_EventActions[5])(peVar3,this->_event);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void RWSocket::Read() {
    if (!_event) {
        _event = _alloter->PoolNew<Event>();
        _event->SetSocket(shared_from_this());
    }

    auto actions = GetEventActions();
    if (actions) {
        actions->AddRecvEvent(_event);
    }
}